

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O0

double testExtendedKalmanFilterLTV(void)

{
  Scalar SVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  result_type rVar7;
  RealScalar RVar8;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> PVar9
  ;
  Index *local_e960;
  Index *local_e930;
  Index *local_e918;
  Index *local_e7c8;
  Index *local_e7a8;
  Index *local_e788;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_e778;
  undefined1 local_e760 [8];
  StateVector error;
  undefined1 local_e740 [8];
  Cmatrix c;
  Amatrix a;
  double dStack_e708;
  uint i;
  Matrix<double,__1,_1,_0,__1,_1> local_e700;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_e6f0;
  undefined1 local_e6c8 [8];
  StateVector dx;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_e6b0;
  uint local_e69c;
  TransposeReturnType TStack_e698;
  uint i_4;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_e690;
  uint local_e67c;
  undefined1 local_e678 [4];
  uint i_3;
  Pmatrix p;
  StateVector xh;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_e640;
  Matrix<double,__1,_1,_0,__1,_1> local_e628;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_e618;
  Matrix<double,__1,_1,_0,__1,_1> local_e600;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_e5f0;
  double local_e5e0;
  double local_e5d8;
  undefined1 local_e5d0 [8];
  normal_distribution<double> g_1;
  undefined1 local_e5b8 [4];
  uint i_2;
  MeasureVector w;
  double local_e598;
  double local_e590;
  undefined1 local_e588 [8];
  normal_distribution<double> g;
  undefined1 local_e570 [4];
  uint i_1;
  StateVector v;
  undefined1 local_e558 [4];
  uint k;
  non_const_type local_e548;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_e540;
  undefined1 local_e530 [8];
  Qmatrix q;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_e510;
  undefined1 local_e500 [8];
  Rmatrix r;
  Matrix<double,__1,__1,_0,__1,__1> local_e4e0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_e4c8;
  undefined1 local_e4a0 [8];
  Qmatrix q1;
  Matrix<double,__1,__1,_0,__1,__1> local_e480;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_e468;
  undefined1 local_e440 [8];
  Rmatrix r1;
  lagged_fibonacci1279 gen_;
  StateVector x;
  InputVector uk [1001];
  MeasureVector yk [1000];
  StateVector xk [1001];
  KalmanFunctorLTV func;
  
  if (testExtendedKalmanFilterLTV()::f == '\0') {
    iVar3 = __cxa_guard_acquire(&testExtendedKalmanFilterLTV()::f);
    if (iVar3 != 0) {
      stateObservation::ExtendedKalmanFilter::ExtendedKalmanFilter
                ((ExtendedKalmanFilter *)testExtendedKalmanFilterLTV()::f,4,3,1,true,true);
      __cxa_atexit(stateObservation::ExtendedKalmanFilter::~ExtendedKalmanFilter,
                   testExtendedKalmanFilterLTV()::f,&__dso_handle);
      __cxa_guard_release(&testExtendedKalmanFilterLTV()::f);
    }
  }
  testExtendedKalmanFilterLTV::KalmanFunctorLTV::KalmanFunctorLTV
            ((KalmanFunctorLTV *)
             &xk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  stateObservation::ExtendedKalmanFilter::setFunctor
            ((DynamicalSystemFunctorBase *)testExtendedKalmanFilterLTV()::f);
  local_e788 = &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
  do {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_e788);
    local_e788 = local_e788 + 2;
  } while (local_e788 !=
           &xk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          );
  local_e7a8 = &uk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
  do {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_e7a8);
    local_e7a8 = local_e7a8 + 2;
  } while (local_e7a8 !=
           &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  ;
  local_e7c8 = &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  do {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_e7c8);
    local_e7c8 = local_e7c8 + 2;
  } while (local_e7c8 !=
           &uk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          );
  stateObservation::ObserverBase::stateVectorZero();
  boost::random::lagged_fibonacci_01_engine<double,_48,_1279U,_418U>::lagged_fibonacci_01_engine
            ((lagged_fibonacci_01_engine<double,_48,_1279U,_418U> *)
             &r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  stateObservation::KalmanFilterBase::getRmatrixRandom();
  q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (&local_e468,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_e480,
             (double *)
             &q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_e440,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_e468);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_e480);
  stateObservation::KalmanFilterBase::getQmatrixRandom();
  r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (&local_e4c8,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_e4e0,
             (double *)
             &r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_e4a0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_e4c8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_e4e0);
  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e440);
  local_e510 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_e440,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_e500,&local_e510);
  local_e548 = (non_const_type)
               Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e4a0);
  local_e540 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_e4a0,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&local_e548);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_e530,&local_e540);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(Matrix<double,__1,_1,_0,__1,_1> *)(gen_.x + 0x4fe));
  stateObservation::ObserverBase::inputVectorRandom();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_e558);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_e558);
  for (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 1;
      v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ <
      0x3e9; v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
                  = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows._4_4_ + 1) {
    stateObservation::ObserverBase::stateVectorZero();
    g._sigma._4_4_ = 0;
    while( true ) {
      uVar2 = g._sigma._4_4_;
      uVar4 = stateObservation::ObserverBase::getStateSize();
      if (uVar4 <= uVar2) break;
      local_e590 = 0.0;
      local_e598 = 1.0;
      boost::random::normal_distribution<double>::normal_distribution
                ((normal_distribution<double> *)local_e588,&local_e590,&local_e598);
      rVar7 = boost::random::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)local_e588,
                         (lagged_fibonacci_01_engine<double,_48,_1279U,_418U> *)
                         &r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_e570,
                          (ulong)g._sigma._4_4_);
      *pSVar5 = rVar7;
      g._sigma._4_4_ = g._sigma._4_4_ + 1;
    }
    PVar9 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_e4a0,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_e570);
    w.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)PVar9.m_lhs;
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)local_e570,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&w.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              );
    stateObservation::ObserverBase::measureVectorZero();
    g_1._sigma._4_4_ = 0;
    while( true ) {
      uVar2 = g_1._sigma._4_4_;
      uVar4 = stateObservation::ObserverBase::getMeasureSize();
      if (uVar4 <= uVar2) break;
      local_e5d8 = 0.0;
      local_e5e0 = 1.0;
      boost::random::normal_distribution<double>::normal_distribution
                ((normal_distribution<double> *)local_e5d0,&local_e5d8,&local_e5e0);
      rVar7 = boost::random::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)local_e5d0,
                         (lagged_fibonacci_01_engine<double,_48,_1279U,_418U> *)
                         &r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_e5b8,
                          (ulong)g_1._sigma._4_4_);
      *pSVar5 = rVar7;
      g_1._sigma._4_4_ = g_1._sigma._4_4_ + 1;
    }
    PVar9 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_e440,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_e5b8);
    local_e5f0 = PVar9;
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)local_e5b8,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_e5f0);
    stateObservation::ObserverBase::inputVectorRandom();
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &uk[(ulong)v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows._4_4_ - 1].
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               &local_e600);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_e600);
    testExtendedKalmanFilterLTV()::KalmanFunctorLTV::stateDynamics(Eigen::
    Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__unsigned_int_
              (&local_e628,
               (StateVector *)
               &xk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(InputVector *)(gen_.x + 0x4fe),
               (int)&x + 8 +
               (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
                _4_4_ - 1) * 0x10);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_e618,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_e628,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_e570);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)(gen_.x + 0x4fe),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_e618);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_e628);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &yk[(ulong)v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows._4_4_ + 999].
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (Matrix<double,__1,_1,_0,__1,_1> *)(gen_.x + 0x4fe));
    testExtendedKalmanFilterLTV()::KalmanFunctorLTV::measureDynamics(Eigen::
    Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__unsigned_int_
              (&xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (StateVector *)
               &xk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(InputVector *)(gen_.x + 0x4fe),
               (int)&x + 8 +
               v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
               _4_4_ * 0x10);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_e640,
               (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
               &xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_e5b8);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)
               &uk[(ulong)(v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows._4_4_ - 1) + 1000].
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_e640);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_e5b8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_e570);
  }
  stateObservation::ObserverBase::stateVectorRandom();
  stateObservation::ZeroDelayObserver::setState
            ((Matrix *)testExtendedKalmanFilterLTV()::f,(int)&p + 0x10);
  stateObservation::KalmanFilterBase::getPmatrixZero();
  local_e67c = 0;
  while( true ) {
    uVar2 = local_e67c;
    uVar4 = stateObservation::ObserverBase::getStateSize();
    if (uVar4 <= uVar2) break;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols,(ulong)local_e67c);
    SVar1 = *pSVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_e678,
                        (ulong)local_e67c,(ulong)local_e67c);
    *pSVar6 = SVar1;
    local_e67c = local_e67c + 1;
  }
  TStack_e698 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e678);
  local_e690 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_e678,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&stack0xffffffffffff1968);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)local_e678,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_e690);
  stateObservation::KalmanFilterBase::setStateCovariance((Matrix *)testExtendedKalmanFilterLTV()::f)
  ;
  stateObservation::KalmanFilterBase::setR((Matrix *)testExtendedKalmanFilterLTV()::f);
  stateObservation::KalmanFilterBase::setQ((Matrix *)testExtendedKalmanFilterLTV()::f);
  stateObservation::ZeroDelayObserver::setInput
            ((Matrix *)testExtendedKalmanFilterLTV()::f,(int)&x + 8);
  local_e69c = 0;
  while( true ) {
    uVar2 = local_e69c;
    uVar4 = stateObservation::ObserverBase::getStateSize();
    if (uVar4 <= uVar2) break;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols,(ulong)local_e69c);
    SVar1 = *pSVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_e678,
                        (ulong)local_e69c,(ulong)local_e69c);
    *pSVar6 = SVar1;
    local_e69c = local_e69c + 1;
  }
  dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e678);
  local_e6b0 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_e678,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)local_e678,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_e6b0);
  stateObservation::ObserverBase::stateVectorConstant(1.0);
  dStack_e708 = 1e-08;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            (&local_e6f0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_e700,
             &stack0xffffffffffff18f8);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((Matrix<double,_1,1,0,_1,1> *)local_e6c8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_e6f0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_e700);
  for (a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ = 1
      ; a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_ <
        0x3e9; a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
               _4_4_ = a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_cols._4_4_ + 1) {
    stateObservation::ZeroDelayObserver::setMeasurement
              ((Matrix *)testExtendedKalmanFilterLTV()::f,
               (int)uk + 0x3e88 +
               (a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
                _4_4_ - 1) * 0x10);
    stateObservation::ZeroDelayObserver::setInput
              ((Matrix *)testExtendedKalmanFilterLTV()::f,
               (int)&x + 8 +
               a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
               _4_4_ * 0x10);
    stateObservation::ExtendedKalmanFilter::getAMatrixFD
              ((Matrix *)
               &c.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
    ;
    stateObservation::ExtendedKalmanFilter::getCMatrixFD((Matrix *)local_e740);
    stateObservation::KalmanFilterBase::setA((Matrix *)testExtendedKalmanFilterLTV()::f);
    stateObservation::KalmanFilterBase::setC((Matrix *)testExtendedKalmanFilterLTV()::f);
    stateObservation::ZeroDelayObserver::getEstimatedState((int)&error + 8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
               (Matrix<double,__1,_1,_0,__1,_1> *)
               &error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_e740);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &c.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
    ;
  }
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (&local_e778,
             (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
             &p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &xk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,_1,1,0,_1,1> *)local_e760,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_e778);
  RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_e760);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_e760);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_e6c8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_e678)
  ;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_e530)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_e500)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_e4a0)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_e440)
  ;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)(gen_.x + 0x4fe));
  local_e918 = &uk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
  do {
    local_e918 = local_e918 + -2;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_e918);
  } while (local_e918 !=
           &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  local_e930 = &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
  do {
    local_e930 = local_e930 + -2;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_e930);
  } while (local_e930 !=
           &uk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          );
  local_e960 = &xk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
  do {
    local_e960 = local_e960 + -2;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_e960);
  } while (local_e960 !=
           &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  ;
  testExtendedKalmanFilterLTV::KalmanFunctorLTV::~KalmanFunctorLTV
            ((KalmanFunctorLTV *)
             &xk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  return RVar8;
}

Assistant:

double testExtendedKalmanFilterLTV()
{
    const static unsigned kmax=1000;

    typedef stateObservation::ExtendedKalmanFilter ekf;

    static ekf f(4,3,1);


    struct KalmanFunctorLTV:
                public stateObservation::DynamicalSystemFunctorBase
    {

public:
        KalmanFunctorLTV()
        {
            s_=f.stateVectorRandom();
            n_=f.measureVectorRandom();

            for (unsigned i=0;i<=kmax;++i)
            {
                a.push_back( f.getAmatrixRandom()*0.5 );
                c.push_back( f.getCmatrixRandom() );
            }

        }

        virtual ekf::StateVector stateDynamics(const ekf::StateVector& x, const ekf::InputVector& u, unsigned k)
        {
            ekf::StateVector xk1;
            unsigned kk=std::min(k,kmax);
            xk1=a[kk]*x+(u.transpose()*u)(0,0)*s_;

            return xk1;
        }

        virtual ekf::MeasureVector measureDynamics(const ekf::StateVector& x, const ekf::InputVector &u,unsigned k)
        {
            (void)k;//unused
            (void)u;//unused

            ekf::MeasureVector yk;
            unsigned kk=std::min(k,kmax);
            yk=c[kk]*x+(u.transpose()*u)(0,0)*n_;
            return yk;
        }

        virtual unsigned getStateSize() const
        {
            return f.getStateSize();
        }

        virtual unsigned getInputSize() const
        {
            return f.getInputSize();
        }

        virtual unsigned getMeasurementSize() const
        {
            return f.getMeasureSize();
        }

        std::vector<ekf::Amatrix, Eigen::aligned_allocator<ekf::Amatrix> > a;
        std::vector<ekf::Cmatrix, Eigen::aligned_allocator<ekf::Cmatrix> > c;
private:
        ekf::StateVector s_;
        ekf::MeasureVector n_;
    };


    KalmanFunctorLTV func;

    f.setFunctor(&func);



    ekf::StateVector xk[kmax+1];
    ekf::MeasureVector yk[kmax];
    ekf::InputVector uk[kmax+1];

    ekf::StateVector x=f.stateVectorZero();



    boost::lagged_fibonacci1279 gen_;

    ekf::Rmatrix r1=f.getRmatrixRandom()*0.01;

    ekf::Qmatrix q1=f.getQmatrixRandom()*0.01;

    ekf::Rmatrix r(r1*r1.transpose());
    ekf::Qmatrix q(q1*q1.transpose());

    xk[0]=x;
    uk[0]=f.inputVectorRandom();

    for (unsigned k=1; k<=kmax; ++k)
    {
        ekf::StateVector v(f.stateVectorZero());
        for (unsigned i=0;i<f.getStateSize();++i)
        {
            boost::normal_distribution<> g(0, 1);
            v[i]=g(gen_);
        }
        v=q1*v;

        ekf::MeasureVector w(f.measureVectorZero());
        for (unsigned i=0;i<f.getMeasureSize();++i)
        {
            boost::normal_distribution<> g(0, 1);
            w[i]=g(gen_);
        }
        w=r1*w;

        uk[k]=f.inputVectorRandom();

        x=func.stateDynamics(x,uk[k-1],k-1)+v;

        xk[k]=x;
        yk[k-1]=func.measureDynamics(x,uk[k],k)+w;

    }

    ekf::StateVector xh=f.stateVectorRandom();

    f.setState(xh,0);

    ekf::Pmatrix p=f.getPmatrixZero();

    for (unsigned i=0;i<f.getStateSize();++i)
    {
        p(i,i)=xh[i];
    }
    p=p*p.transpose();


    f.setStateCovariance(p);

    f.setR(r);
    f.setQ(q);

    f.setInput(uk[0],0);

    for (unsigned i=0;i<f.getStateSize();++i)
    {
        p(i,i)=xh[i];
    }
    p=p*p.transpose();

    ekf::StateVector dx=f.stateVectorConstant(1)*1e-8;

    unsigned i;
    for (i=1;i<=kmax;++i)
    {
        f.setMeasurement(yk[i-1],i);
        f.setInput(uk[i],i);


        ekf::Amatrix a=f.getAMatrixFD(dx);
        ekf::Cmatrix c= f.getCMatrixFD(dx);

        f.setA(a);
        f.setC(c);

        xh=f.getEstimatedState(i);
    }

    ekf::StateVector error=xh-xk[kmax];

    return error.norm();

}